

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VMinLocal(N_Vector X,sunindextype local_length,int myid)

{
  int iVar1;
  uint in_EDX;
  N_Vector in_RDI;
  double dVar2;
  undefined8 uVar3;
  double dVar4;
  double dVar5;
  sunrealtype negmyid;
  sunrealtype ans;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int fails;
  sunrealtype in_stack_ffffffffffffffc0;
  sunindextype in_stack_ffffffffffffffc8;
  N_Vector in_stack_ffffffffffffffd0;
  int local_18;
  
  local_18 = 0;
  N_VConst(0x4000000000000000,in_RDI);
  set_element(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  dVar2 = get_time();
  uVar3 = N_VMinLocal(in_RDI);
  sync_device(in_RDI);
  dVar4 = get_time();
  dVar5 = sqrt(2.220446049250313e-16);
  iVar1 = SUNRCompareTol(uVar3,(double)(int)-in_EDX,SUB84(dVar5,0));
  if (iVar1 == 0) {
    if (in_EDX == 0) {
      printf("PASSED test -- N_VMinLocal\n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VMinLocal, Proc %d\n",(ulong)in_EDX);
    local_18 = 1;
  }
  dVar2 = max_time(in_RDI,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",dVar2,"N_VMinLocal");
  }
  return local_18;
}

Assistant:

int Test_N_VMinLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, negmyid;

  /* fill vector data */
  negmyid = (sunrealtype)-myid;
  N_VConst(TWO, X);
  set_element(X, local_length - 1, negmyid);

  start_time = get_time();
  ans        = N_VMinLocal(X);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal negmyid */
  failure = SUNRCompareTol(ans, negmyid, SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VMinLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VMinLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VMinLocal", maxt);

  return (fails);
}